

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_bcread.c
# Opt level: O1

GCproto * lj_bcread_proto(LexState *ls)

{
  char **pp;
  uint64_t uVar1;
  ushort *puVar2;
  byte bVar3;
  byte bVar4;
  char cVar5;
  lua_State *plVar6;
  short sVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  uint32_t uVar12;
  uint32_t uVar13;
  uint uVar14;
  uint32_t uVar15;
  uint32_t uVar16;
  GCproto *pGVar17;
  ulong uVar18;
  GCstr *pGVar19;
  void *pvVar20;
  GCtab *t;
  TValue *pTVar21;
  char *pcVar22;
  byte bVar24;
  size_t __n;
  long lVar25;
  uint32_t hbits;
  char *pcVar26;
  double *pdVar27;
  uint uVar28;
  byte bVar29;
  byte *pbVar30;
  uint uVar31;
  uint uVar32;
  undefined8 *puVar33;
  uint uVar34;
  TValue local_38;
  char *pcVar23;
  
  pp = &ls->p;
  pbVar30 = (byte *)ls->p;
  ls->p = (char *)(pbVar30 + 1);
  bVar29 = *pbVar30;
  ls->p = (char *)(pbVar30 + 2);
  bVar24 = pbVar30[1];
  ls->p = (char *)(pbVar30 + 3);
  bVar3 = pbVar30[2];
  ls->p = (char *)(pbVar30 + 4);
  bVar4 = pbVar30[3];
  uVar8 = lj_buf_ruleb128(pp);
  uVar9 = lj_buf_ruleb128(pp);
  uVar10 = lj_buf_ruleb128(pp);
  uVar31 = uVar10 + 1;
  uVar12 = 0;
  uVar13 = 0;
  __n = 0;
  if ((ls->level & 2) == 0) {
    uVar11 = lj_buf_ruleb128(pp);
    uVar12 = 0;
    uVar13 = 0;
    __n = 0;
    if (uVar11 != 0) {
      uVar12 = lj_buf_ruleb128(pp);
      uVar13 = lj_buf_ruleb128(pp);
      __n = (size_t)uVar11;
    }
  }
  uVar28 = uVar31 * 4 + uVar8 * 8 + 0x6f & 0xfffffff8;
  uVar32 = uVar28 + uVar9 * 8;
  uVar14 = ((uint)bVar4 * 2 + 2 & 0xfffffffc) + uVar32;
  uVar34 = (int)__n + uVar14;
  pGVar17 = (GCproto *)lj_mem_newgco(ls->L,(ulong)uVar34);
  pGVar17->gct = '\a';
  pGVar17->numparams = bVar24;
  pGVar17->framesize = bVar3;
  pGVar17->sizebc = uVar31;
  uVar1 = (long)&(pGVar17->nextgc).gcptr64 + (ulong)uVar28;
  (pGVar17->k).ptr64 = uVar1;
  (pGVar17->uv).ptr64 = (long)&(pGVar17->nextgc).gcptr64 + (ulong)uVar32;
  pGVar17->sizekgc = 0;
  pGVar17->sizekn = uVar9;
  pGVar17->sizept = uVar34;
  pGVar17->sizeuv = bVar4;
  pGVar17->flags = bVar29;
  pGVar17->trace = 0;
  (pGVar17->chunkname).gcptr64 = (uint64_t)ls->chunkname;
  *(undefined4 *)(uVar1 + (ulong)(uVar8 + 1) * -8) = 0;
  bVar29 = (bVar29 & 2) >> 1;
  *(uint *)&pGVar17[1].nextgc.gcptr64 = (uint)bVar29 + (uint)bVar29 * 2 + (uint)bVar3 * 0x100 + 0x59
  ;
  uVar18 = (ulong)(uVar31 * 4 - 4);
  pcVar26 = ls->p;
  ls->p = pcVar26 + uVar18;
  memcpy((void *)((long)&pGVar17[1].nextgc.gcptr64 + 4),pcVar26,uVar18);
  if ((1 < uVar31) && ((ls->level & 1) != 0)) {
    lVar25 = 0;
    do {
      uVar28 = *(uint *)((long)&pGVar17[1].nextgc.gcptr64 + lVar25 * 4 + 4);
      *(uint *)((long)&pGVar17[1].nextgc.gcptr64 + lVar25 * 4 + 4) =
           uVar28 >> 0x18 | (uVar28 & 0xff0000) >> 8 | (uVar28 & 0xff00) << 8 | uVar28 << 0x18;
      lVar25 = lVar25 + 1;
    } while ((ulong)uVar31 - 1 != lVar25);
  }
  if (bVar4 != 0) {
    pvVar20 = (void *)(pGVar17->uv).ptr64;
    pcVar26 = ls->p;
    ls->p = pcVar26 + ((uint)bVar4 + (uint)bVar4);
    memcpy(pvVar20,pcVar26,(ulong)((uint)bVar4 + (uint)bVar4));
    if ((ls->level & 1) != 0) {
      uVar18 = 0;
      do {
        puVar2 = (ushort *)((long)pvVar20 + uVar18 * 2);
        *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
        uVar18 = uVar18 + 1;
      } while (bVar4 != uVar18);
    }
  }
  if (uVar8 != 0) {
    puVar33 = (undefined8 *)((pGVar17->k).ptr64 + (ulong)uVar8 * -8);
    uVar11 = 0;
    do {
      uVar15 = lj_buf_ruleb128(pp);
      if (uVar15 < 5) {
        if (uVar15 == 0) {
          plVar6 = ls->L;
          pTVar21 = plVar6->top;
          if (pTVar21 <= (TValue *)((long)ls->lastline + (plVar6->stack).ptr64)) {
            bcread_error(ls,LJ_ERR_BCBAD);
          }
          plVar6->top = pTVar21 + -1;
          pGVar19 = (GCstr *)(pTVar21[-1].u64 & 0x7fffffffffff);
          goto LAB_0012c2b8;
        }
        if (uVar15 == 1) {
          uVar16 = lj_buf_ruleb128(pp);
          uVar15 = lj_buf_ruleb128(pp);
          if (uVar15 == 0) {
            hbits = 0;
          }
          else {
            hbits = 1;
            if (uVar15 != 1) {
              uVar31 = 0x1f;
              if (uVar15 - 1 != 0) {
                for (; uVar15 - 1 >> uVar31 == 0; uVar31 = uVar31 - 1) {
                }
              }
              hbits = (uVar31 ^ 0xffffffe0) + 0x21;
            }
          }
          t = lj_tab_new(ls->L,uVar16,hbits);
          if (uVar16 != 0) {
            pTVar21 = (TValue *)(t->array).ptr64;
            do {
              bcread_ktabk(ls,pTVar21);
              pTVar21 = pTVar21 + 1;
              uVar16 = uVar16 - 1;
            } while (uVar16 != 0);
          }
          for (; uVar15 != 0; uVar15 = uVar15 - 1) {
            bcread_ktabk(ls,&local_38);
            pTVar21 = lj_tab_set(ls->L,t,&local_38);
            bcread_ktabk(ls,pTVar21);
          }
          *puVar33 = t;
        }
        else {
          sVar7 = (uVar15 != 2) + 0xb;
          if (uVar15 == 4) {
            sVar7 = 0x10;
          }
          pvVar20 = lj_mem_newgco(ls->L,(ulong)(uVar15 == 4) * 8 + 0x18);
          *(undefined1 *)((long)pvVar20 + 9) = 10;
          *(short *)((long)pvVar20 + 10) = sVar7;
          *puVar33 = pvVar20;
          uVar16 = lj_buf_ruleb128(pp);
          *(uint32_t *)((long)pvVar20 + 0x10) = uVar16;
          uVar16 = lj_buf_ruleb128(pp);
          *(uint32_t *)((long)pvVar20 + 0x14) = uVar16;
          if (uVar15 == 4) {
            uVar15 = lj_buf_ruleb128(pp);
            *(uint32_t *)((long)pvVar20 + 0x18) = uVar15;
            uVar15 = lj_buf_ruleb128(pp);
            *(uint32_t *)((long)pvVar20 + 0x1c) = uVar15;
          }
        }
      }
      else {
        pcVar26 = ls->p;
        ls->p = pcVar26 + (uVar15 - 5);
        pGVar19 = lj_str_new(ls->L,pcVar26,(ulong)(uVar15 - 5));
LAB_0012c2b8:
        *puVar33 = pGVar19;
      }
      uVar11 = uVar11 + 1;
      puVar33 = puVar33 + 1;
    } while (uVar11 != uVar8);
  }
  pGVar17->sizekgc = uVar8;
  if (uVar9 != 0) {
    pdVar27 = (double *)(pGVar17->k).ptr64;
    uVar8 = 0;
    do {
      bVar29 = **pp;
      pbVar30 = (byte *)(*pp + 1);
      uVar31 = (uint)(bVar29 >> 1);
      if ((char)bVar29 < '\0') {
        uVar31 = uVar31 & 0x3f;
        bVar24 = 6;
        do {
          bVar3 = *pbVar30;
          uVar31 = uVar31 | (bVar3 & 0x7f) << (bVar24 & 0x1f);
          pbVar30 = pbVar30 + 1;
          bVar24 = bVar24 + 7;
        } while ((char)bVar3 < '\0');
      }
      *pp = (char *)pbVar30;
      if ((bVar29 & 1) == 0) {
        *pdVar27 = (double)(int)uVar31;
      }
      else {
        *(uint *)pdVar27 = uVar31;
        uVar11 = lj_buf_ruleb128(pp);
        *(uint32_t *)((long)pdVar27 + 4) = uVar11;
      }
      uVar8 = uVar8 + 1;
      pdVar27 = pdVar27 + 1;
    } while (uVar8 != uVar9);
  }
  pGVar17->firstline = uVar12;
  pGVar17->numline = uVar13;
  if ((int)__n == 0) {
    (pGVar17->lineinfo).ptr64 = 0;
    (pGVar17->uvinfo).ptr64 = 0;
    (pGVar17->varinfo).ptr64 = 0;
  }
  else {
    bVar29 = 2 - ((int)uVar13 < 0x10000);
    if ((int)uVar13 < 0x100) {
      bVar29 = 0;
    }
    pvVar20 = (void *)((long)&(pGVar17->nextgc).gcptr64 + (ulong)uVar14);
    (pGVar17->lineinfo).ptr64 = (uint64_t)pvVar20;
    (pGVar17->uvinfo).ptr64 = (ulong)(uVar10 << (bVar29 & 0x1f)) + (long)pvVar20;
    pcVar26 = ls->p;
    ls->p = pcVar26 + __n;
    memcpy(pvVar20,pcVar26,__n);
    if (((ls->level & 1) != 0) && (0xff < pGVar17->numline)) {
      uVar31 = pGVar17->sizebc - 1;
      if (pGVar17->numline < 0x10000) {
        if (uVar31 != 0) {
          uVar18 = 0;
          do {
            puVar2 = (ushort *)((long)pvVar20 + uVar18 * 2);
            *puVar2 = *puVar2 << 8 | *puVar2 >> 8;
            uVar18 = uVar18 + 1;
          } while (uVar31 != uVar18);
        }
      }
      else if (uVar31 != 0) {
        uVar18 = 0;
        do {
          uVar14 = *(uint *)((long)pvVar20 + uVar18 * 4);
          *(uint *)((long)pvVar20 + uVar18 * 4) =
               uVar14 >> 0x18 | (uVar14 & 0xff0000) >> 8 | (uVar14 & 0xff00) << 8 | uVar14 << 0x18;
          uVar18 = uVar18 + 1;
        } while (uVar31 != uVar18);
      }
    }
    pcVar23 = (char *)(pGVar17->uvinfo).ptr64;
    uVar31 = (uint)pGVar17->sizeuv;
    pcVar22 = pcVar23;
    pcVar26 = pcVar23;
    if (pGVar17->sizeuv != 0) {
      do {
        do {
          pcVar22 = pcVar23 + 1;
          cVar5 = *pcVar26;
          pcVar26 = pcVar26 + 1;
          pcVar23 = pcVar22;
        } while (cVar5 != '\0');
        uVar31 = uVar31 - 1;
        pcVar23 = pcVar26;
      } while (uVar31 != 0);
    }
    (pGVar17->varinfo).ptr64 = (uint64_t)pcVar22;
  }
  return pGVar17;
}

Assistant:

GCproto *lj_bcread_proto(LexState *ls)
{
  GCproto *pt;
  MSize framesize, numparams, flags, sizeuv, sizekgc, sizekn, sizebc, sizept;
  MSize ofsk, ofsuv, ofsdbg;
  MSize sizedbg = 0;
  BCLine firstline = 0, numline = 0;

  /* Read prototype header. */
  flags = bcread_byte(ls);
  numparams = bcread_byte(ls);
  framesize = bcread_byte(ls);
  sizeuv = bcread_byte(ls);
  sizekgc = bcread_uleb128(ls);
  sizekn = bcread_uleb128(ls);
  sizebc = bcread_uleb128(ls) + 1;
  if (!(bcread_flags(ls) & BCDUMP_F_STRIP)) {
    sizedbg = bcread_uleb128(ls);
    if (sizedbg) {
      firstline = bcread_uleb128(ls);
      numline = bcread_uleb128(ls);
    }
  }

  /* Calculate total size of prototype including all colocated arrays. */
  sizept = (MSize)sizeof(GCproto) +
	   sizebc*(MSize)sizeof(BCIns) +
	   sizekgc*(MSize)sizeof(GCRef);
  sizept = (sizept + (MSize)sizeof(TValue)-1) & ~((MSize)sizeof(TValue)-1);
  ofsk = sizept; sizept += sizekn*(MSize)sizeof(TValue);
  ofsuv = sizept; sizept += ((sizeuv+1)&~1)*2;
  ofsdbg = sizept; sizept += sizedbg;

  /* Allocate prototype object and initialize its fields. */
  pt = (GCproto *)lj_mem_newgco(ls->L, (MSize)sizept);
  pt->gct = ~LJ_TPROTO;
  pt->numparams = (uint8_t)numparams;
  pt->framesize = (uint8_t)framesize;
  pt->sizebc = sizebc;
  setmref(pt->k, (char *)pt + ofsk);
  setmref(pt->uv, (char *)pt + ofsuv);
  pt->sizekgc = 0;  /* Set to zero until fully initialized. */
  pt->sizekn = sizekn;
  pt->sizept = sizept;
  pt->sizeuv = (uint8_t)sizeuv;
  pt->flags = (uint8_t)flags;
  pt->trace = 0;
  setgcref(pt->chunkname, obj2gco(ls->chunkname));

  /* Close potentially uninitialized gap between bc and kgc. */
  *(uint32_t *)((char *)pt + ofsk - sizeof(GCRef)*(sizekgc+1)) = 0;

  /* Read bytecode instructions and upvalue refs. */
  bcread_bytecode(ls, pt, sizebc);
  bcread_uv(ls, pt, sizeuv);

  /* Read constants. */
  bcread_kgc(ls, pt, sizekgc);
  pt->sizekgc = sizekgc;
  bcread_knum(ls, pt, sizekn);

  /* Read and initialize debug info. */
  pt->firstline = firstline;
  pt->numline = numline;
  if (sizedbg) {
    MSize sizeli = (sizebc-1) << (numline < 256 ? 0 : numline < 65536 ? 1 : 2);
    setmref(pt->lineinfo, (char *)pt + ofsdbg);
    setmref(pt->uvinfo, (char *)pt + ofsdbg + sizeli);
    bcread_dbg(ls, pt, sizedbg);
    setmref(pt->varinfo, bcread_varinfo(pt));
  } else {
    setmref(pt->lineinfo, NULL);
    setmref(pt->uvinfo, NULL);
    setmref(pt->varinfo, NULL);
  }
  return pt;
}